

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.h
# Opt level: O2

void __thiscall JSMNUtilsEx::JSMNUtilsEx(JSMNUtilsEx *this,string *errmsg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"jsmnutils error: ",errmsg);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_0010cd70;
  return;
}

Assistant:

JSMNUtilsEx(std::string errmsg) :
        std::runtime_error("jsmnutils error: " + errmsg) {}